

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O3

void __thiscall module::listFilesRecursively(module *this,string *basePath,string *filename)

{
  pointer pcVar1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  size_t sVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  char *__s1;
  undefined8 uVar7;
  ulong uVar8;
  string path;
  undefined8 *local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  module *local_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  string local_90;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  string local_50;
  
  __dirp = opendir((basePath->_M_dataplus)._M_p);
  if (__dirp != (DIR *)0x0) {
    local_70 = local_60;
    local_68 = 0;
    local_60[0] = 0;
    local_b8 = this;
    while( true ) {
      pdVar3 = readdir(__dirp);
      if (pdVar3 == (dirent *)0x0) break;
      if ((pdVar3->d_name[0] != '.') ||
         ((pdVar3->d_name[1] != '\0' && ((pdVar3->d_name[1] != '.' || (pdVar3->d_name[2] != '\0'))))
         )) {
        __s1 = pdVar3->d_name;
        iVar2 = strcmp(__s1,(filename->_M_dataplus)._M_p);
        if (iVar2 == 0) {
          std::operator+(&local_d8,basePath,&this->sepd);
          puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
          puVar6 = puVar5 + 2;
          if ((undefined8 *)*puVar5 == puVar6) {
            local_e8 = *puVar6;
            uStack_e0 = puVar5[3];
            local_f8 = &local_e8;
          }
          else {
            local_e8 = *puVar6;
            local_f8 = (undefined8 *)*puVar5;
          }
          local_f0 = puVar5[1];
          *puVar5 = puVar6;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_b8->module_header,(string *)&local_f8);
          if (local_f8 != &local_e8) {
            operator_delete(local_f8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p);
          }
          break;
        }
        std::operator+(&local_d8,basePath,&this->sepd);
        local_b0 = local_a0;
        sVar4 = strlen(__s1);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,__s1,__s1 + sVar4);
        uVar7 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          uVar7 = local_d8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar7 < local_a8 + local_d8._M_string_length) {
          uVar8 = 0xf;
          if (local_b0 != local_a0) {
            uVar8 = local_a0[0];
          }
          if (uVar8 < local_a8 + local_d8._M_string_length) goto LAB_00110eca;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_b0,0,(char *)0x0,(ulong)local_d8._M_dataplus._M_p);
        }
        else {
LAB_00110eca:
          puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_b0);
        }
        local_f8 = &local_e8;
        puVar6 = puVar5 + 2;
        if ((undefined8 *)*puVar5 == puVar6) {
          local_e8 = *puVar6;
          uStack_e0 = puVar5[3];
        }
        else {
          local_e8 = *puVar6;
          local_f8 = (undefined8 *)*puVar5;
        }
        local_f0 = puVar5[1];
        *puVar5 = puVar6;
        puVar5[1] = 0;
        *(undefined1 *)puVar6 = 0;
        std::__cxx11::string::operator=((string *)&local_70,(string *)&local_f8);
        if (local_f8 != &local_e8) {
          operator_delete(local_f8);
        }
        if (local_b0 != local_a0) {
          operator_delete(local_b0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_70,local_70 + local_68);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar1 = (filename->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar1,pcVar1 + filename->_M_string_length);
        listFilesRecursively(local_b8,&local_90,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
      }
    }
    closedir(__dirp);
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
  }
  return;
}

Assistant:

void module::listFilesRecursively(std::string basePath, std::string filename)
{
    DIR *dir = opendir(basePath.c_str());
    if (!dir)
    {
        return;
    }

    std::string path;
    struct dirent *dp;
    while ((dp = readdir(dir)) != NULL)
    {
        if (strcmp(dp->d_name, ".") != 0 && strcmp(dp->d_name, "..") != 0)
        {
            if (strcmp(dp->d_name, filename.c_str()) == 0)
            {
                module_header = basePath + sepd + dp->d_name;
                break;
            }

            // Construct new path from our base path
            path = basePath + sepd + std::string(dp->d_name);

            listFilesRecursively(path, filename);
        }
    }

    closedir(dir);
}